

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O3

void pbrt::anon_class_1_0_00000001::__invoke(StatsAccumulator *accum)

{
  long in_FS_OFFSET;
  
  StatsAccumulator::ReportPercentage
            (accum,"Camera/Rays vignetted by lens system",*(int64_t *)(in_FS_OFFSET + -0x18),
             *(int64_t *)(in_FS_OFFSET + -0x10));
  *(undefined8 *)(in_FS_OFFSET + -0x18) = 0;
  *(undefined8 *)(in_FS_OFFSET + -0x10) = 0;
  return;
}

Assistant:

ParsedScene::ParsedScene() {
    // Set scene defaults
    camera.name = "perspective";
    sampler.name = "pmj02bn";
    filter.name = "gaussian";
    integrator.name = "volpath";

    ParameterDictionary dict({}, RGBColorSpace::sRGB);
    materials.push_back(SceneEntity("diffuse", dict, {}));
    accelerator.name = "bvh";
    film.name = "rgb";
    film.parameters = ParameterDictionary({}, RGBColorSpace::sRGB);
}